

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

string * sc_core::sc_trace_file_base::fs_unit_to_str_abi_cxx11_(unit_type tu)

{
  ostream *poVar1;
  ulonglong in_RSI;
  string *in_RDI;
  stringstream ss;
  undefined8 in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  allocator *paVar2;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  sc_severity severity_;
  allocator local_1e1;
  string local_1e0 [32];
  stringstream local_1c0 [16];
  ostream local_1b0 [379];
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ulonglong local_10;
  
  severity_ = (sc_severity)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (in_RSI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 fs",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else if (in_RSI == 10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 fs",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_RSI == 100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 fs",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_RSI == 1000) {
    paVar2 = &local_27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 ps",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_RSI == 10000) {
    paVar2 = &local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 ps",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (in_RSI == 100000) {
    paVar2 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 ps",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (in_RSI == 1000000) {
    paVar2 = &local_2a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 ns",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (in_RSI == 10000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 ns",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (in_RSI == 100000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 ns",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (in_RSI == 1000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 us",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (in_RSI == 10000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 us",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (in_RSI == 100000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 us",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (in_RSI == 1000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 ms",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else if (in_RSI == 10000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 ms",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (in_RSI == 100000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 ms",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  else if (in_RSI == 1000000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1 sec",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
  }
  else if (in_RSI == 10000000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"10 sec",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
  }
  else if (in_RSI == 100000000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"100 sec",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else {
    local_10 = in_RSI;
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar1 = std::operator<<(local_1b0,"not a power of ten: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::operator<<(poVar1," fs");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sc_report_handler::report
              (severity_,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_1e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return in_RDI;
}

Assistant:

std::string
sc_trace_file_base::fs_unit_to_str(sc_trace_file_base::unit_type tu)
{
    switch (tu)
    {
        case UINT64_C(1): return "1 fs";
        case UINT64_C(10): return "10 fs";
        case UINT64_C(100): return "100 fs";
        case UINT64_C(1000): return "1 ps";
        case UINT64_C(10000): return "10 ps";
        case UINT64_C(100000): return "100 ps";
        case UINT64_C(1000000): return "1 ns";
        case UINT64_C(10000000): return "10 ns";
        case UINT64_C(100000000): return "100 ns";
        case UINT64_C(1000000000): return "1 us";
        case UINT64_C(10000000000): return "10 us";
        case UINT64_C(100000000000): return "100 us";
        case UINT64_C(1000000000000): return "1 ms";
        case UINT64_C(10000000000000): return "10 ms";
        case UINT64_C(100000000000000): return "100 ms";
        case UINT64_C(1000000000000000): return "1 sec";
        case UINT64_C(10000000000000000): return "10 sec";
        case UINT64_C(100000000000000000): return "100 sec";
        default: /* fail below */ (void)0;
    }

    std::stringstream ss;
    ss << "not a power of ten: " << tu << " fs";
    SC_REPORT_ERROR( SC_ID_TRACING_INVALID_TIMESCALE_UNIT_,
                     ss.str().c_str() );
    return "";
}